

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

bool testing::internal::
     TypeParameterizedTest<HashtableAllTest,_testing::internal::TemplateSel<HashtableAllTest_Clear_Test>,_testing::internal::Types<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>_>
     ::Register(char *prefix,CodeLocation *code_location,char *case_name,char *test_names,int index,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  pointer pcVar1;
  type_info *ptVar2;
  long *plVar3;
  _Alloc_hider type_param;
  bool bVar4;
  int iVar5;
  long *plVar6;
  char *pcVar7;
  SetUpTearDownSuiteFuncType set_up_tc;
  SetUpTearDownSuiteFuncType tear_down_tc;
  TestFactoryBase *factory;
  long *plVar8;
  ulong uVar9;
  type_info *ptVar10;
  type_info *ptVar11;
  allocator local_182;
  allocator local_181;
  type_info *local_180;
  long local_178;
  type_info local_170 [8];
  undefined8 uStack_168;
  int local_15c;
  char *local_158;
  type_info *local_150;
  long local_148;
  type_info local_140 [8];
  undefined8 uStack_138;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  long *local_110;
  char *local_108;
  char *local_100;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  CodeLocation local_98;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_158 = case_name;
  std::__cxx11::string::string((string *)local_50,prefix,&local_182);
  local_100 = prefix;
  plVar6 = (long *)std::__cxx11::string::append((char *)local_50);
  local_f8 = &local_e8;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_e8 = *plVar8;
    lStack_e0 = plVar6[3];
  }
  else {
    local_e8 = *plVar8;
    local_f8 = (long *)*plVar6;
  }
  local_f0 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
  local_d8 = &local_c8;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_c8 = *plVar8;
    lStack_c0 = plVar6[3];
  }
  else {
    local_c8 = *plVar8;
    local_d8 = (long *)*plVar6;
  }
  local_d0 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_d8);
  local_b8 = &local_a8;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_a8 = *plVar8;
    lStack_a0 = plVar6[3];
  }
  else {
    local_a8 = *plVar8;
    local_b8 = (long *)*plVar6;
  }
  local_b0 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_b8,
                              (ulong)(type_names->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start[index]._M_dataplus.
                                     _M_p);
  local_130 = &local_120;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_120 = *plVar8;
    lStack_118 = plVar6[3];
  }
  else {
    local_120 = *plVar8;
    local_130 = (long *)*plVar6;
  }
  plVar3 = local_130;
  local_128 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  pcVar7 = strchr(test_names,0x2c);
  local_108 = test_names;
  if (pcVar7 == (char *)0x0) {
    std::__cxx11::string::string((string *)&local_180,test_names,&local_181);
  }
  else {
    local_180 = local_170;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,test_names,pcVar7);
  }
  local_110 = plVar3;
  local_150 = local_180;
  local_15c = index;
  if (local_178 != 0) {
    ptVar10 = local_180 + local_178;
    do {
      ptVar2 = local_180;
      iVar5 = isspace((uint)(byte)ptVar10[-1]);
      local_150 = ptVar2;
      if (iVar5 == 0) break;
      ptVar11 = ptVar10 + -1;
      uVar9 = (long)ptVar11 - (long)ptVar2;
      std::__cxx11::string::_M_erase((ulong)&local_180,uVar9);
      ptVar10 = local_180 + uVar9;
      local_150 = local_180;
    } while (ptVar11 != ptVar2);
  }
  local_180 = local_170;
  if (local_150 == local_180) {
    uStack_138 = uStack_168;
    local_150 = local_140;
  }
  ptVar10 = local_150;
  local_148 = local_178;
  local_178 = 0;
  local_170[0] = (type_info)0x0;
  GetTypeName_abi_cxx11_
            (&local_70,
             (internal *)
             &google::
              HashtableInterface_SparseHashMap<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
              ::typeinfo,local_180);
  type_param._M_p = local_70._M_dataplus._M_p;
  local_98.file._M_dataplus._M_p = (pointer)&local_98.file.field_2;
  pcVar1 = (code_location->file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar1,pcVar1 + (code_location->file)._M_string_length);
  local_98.line = code_location->line;
  set_up_tc = SuiteApiResolver<HashtableAllTest_Clear_Test<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>_>
              ::GetSetUpCaseOrSuite((code_location->file)._M_dataplus._M_p,local_98.line);
  tear_down_tc = SuiteApiResolver<HashtableAllTest_Clear_Test<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>_>
                 ::GetTearDownCaseOrSuite
                           ((code_location->file)._M_dataplus._M_p,code_location->line);
  factory = (TestFactoryBase *)operator_new(8);
  factory->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_00c2e3f8;
  MakeAndRegisterTestInfo
            ((char *)local_110,(char *)ptVar10,type_param._M_p,(char *)0x0,&local_98,
             &TypeIdHelper<HashtableAllTest<google::HashtableInterface_SparseHashMap<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>>>
              ::dummy_,set_up_tc,tear_down_tc,factory);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.file._M_dataplus._M_p != &local_98.file.field_2) {
    operator_delete(local_98.file._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_150 != local_140) {
    operator_delete(local_150);
  }
  if (local_180 != local_170) {
    operator_delete(local_180);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  pcVar7 = local_108;
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  bVar4 = TypeParameterizedTest<HashtableAllTest,_testing::internal::TemplateSel<HashtableAllTest_Clear_Test>,_testing::internal::Types<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>_>
          ::Register(local_100,code_location,local_158,pcVar7,local_15c + 1,type_names);
  return bVar4;
}

Assistant:

static bool Register(const char* prefix, const CodeLocation& code_location,
                       const char* case_name, const char* test_names, int index,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        (std::string(prefix) + (prefix[0] == '\0' ? "" : "/") + case_name +
         "/" + type_names[static_cast<size_t>(index)])
            .c_str(),
        StripTrailingSpaces(GetPrefixUntilComma(test_names)).c_str(),
        GetTypeName<Type>().c_str(),
        nullptr,  // No value parameter.
        code_location, GetTypeId<FixtureClass>(),
        SuiteApiResolver<TestClass>::GetSetUpCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        SuiteApiResolver<TestClass>::GetTearDownCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel,
                                 typename Types::Tail>::Register(prefix,
                                                                 code_location,
                                                                 case_name,
                                                                 test_names,
                                                                 index + 1,
                                                                 type_names);
  }